

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

void matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::And>_>::processIdImpl
               (Id<mathiu::impl::And> *idPat,int32_t depth,IdProcess idProcess)

{
  IdBlockBase<mathiu::impl::And> *pIVar1;
  
  if (idProcess == kCONFIRM) {
    pIVar1 = &Id<mathiu::impl::And>::block(idPat)->super_IdBlockBase<mathiu::impl::And>;
    IdBlockBase<mathiu::impl::And>::confirm(pIVar1,depth);
    return;
  }
  if (idProcess != kCANCEL) {
    return;
  }
  pIVar1 = &Id<mathiu::impl::And>::block(idPat)->super_IdBlockBase<mathiu::impl::And>;
  IdBlockBase<mathiu::impl::And>::reset(pIVar1,depth);
  return;
}

Assistant:

constexpr static void processIdImpl(Id<Type> const &idPat, int32_t depth,
                                                IdProcess idProcess)
            {
                switch (idProcess)
                {
                case IdProcess::kCANCEL:
                    idPat.reset(depth);
                    break;

                case IdProcess::kCONFIRM:
                    idPat.confirm(depth);
                    break;
                }
            }